

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O1

char * __thiscall
gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::StageName
          (ShaderImageLoadStoreBase *this,int stage)

{
  if ((uint)this < 5) {
    return &DAT_01aab540 + *(int *)(&DAT_01aab540 + ((ulong)this & 0xffffffff) * 4);
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                ,599,
                "const char *gl4cts::(anonymous namespace)::ShaderImageLoadStoreBase::StageName(int)"
               );
}

Assistant:

const char* StageName(int stage)
	{
		switch (stage)
		{
		case 0:
			return "Vertex Shader";
		case 1:
			return "Tessellation Control Shader";
		case 2:
			return "Tessellation Evaluation Shader";
		case 3:
			return "Geometry Shader";
		case 4:
			return "Compute Shader";
		}
		assert(0);
		return NULL;
	}